

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putkey.c
# Opt level: O3

int ffd2e(double dval,int decim,char *cval,int *status)

{
  uint uVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  undefined8 in_R8;
  undefined8 in_R9;
  
  uVar1 = *status;
  if (0 < (int)uVar1) {
    return uVar1;
  }
  *cval = '\0';
  if (decim < 0) {
    iVar2 = snprintf(cval,0x47,"%.*G",(ulong)(uint)-decim);
    if (iVar2 < 0) goto LAB_001a9725;
    pcVar4 = strchr(cval,0x2e);
    if (((pcVar4 == (char *)0x0) && (pcVar4 = strchr(cval,0x2c), pcVar4 == (char *)0x0)) &&
       (pcVar4 = strchr(cval,0x45), pcVar4 != (char *)0x0)) {
      iVar2 = snprintf(cval,0x47,"%.1E",dval);
      if (iVar2 < 0) {
        ffpmsg("Error in ffd2e converting float to string");
        *status = 0x192;
      }
      pcVar4 = strchr(cval,0x2c);
      if (pcVar4 != (char *)0x0) {
        *pcVar4 = '.';
      }
      goto LAB_001a9737;
    }
LAB_001a96f0:
    if (0 < *status) goto LAB_001a9737;
    pcVar4 = strchr(cval,0x2c);
    if (pcVar4 != (char *)0x0) {
      *pcVar4 = '.';
    }
    pcVar4 = strchr(cval,0x4e);
    if (pcVar4 == (char *)0x0) {
      pcVar4 = strchr(cval,0x2e);
      if (((pcVar4 == (char *)0x0) && (pcVar4 = strchr(cval,0x45), pcVar4 == (char *)0x0)) &&
         (sVar3 = strlen(cval), sVar3 < 0x46)) {
        sVar3 = strlen(cval);
        (cval + sVar3)[0] = '.';
        (cval + sVar3)[1] = '\0';
      }
      goto LAB_001a9737;
    }
    pcVar4 = "Error in ffd2e: double value is a NaN or INDEF";
  }
  else {
    iVar2 = snprintf(cval,0x47,"%.*E",decim,in_R8,in_R9,(ulong)uVar1);
    if (-1 < iVar2) goto LAB_001a96f0;
LAB_001a9725:
    pcVar4 = "Error in ffd2e converting float to string";
  }
  ffpmsg(pcVar4);
  *status = 0x192;
LAB_001a9737:
  return *status;
}

Assistant:

int ffd2e(double dval,  /* I - value to be converted to a string */
          int decim,    /* I - number of decimal places to display */
          char *cval,   /* O - character string representation of the value */
          int *status)  /* IO - error status */
/*
  convert double value to a null-terminated exponential format string.
*/
{
    char *cptr;

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    cval[0] = '\0';

    if (decim < 0)
    {   /* use G format if decim is negative */
        if ( snprintf(cval, FLEN_VALUE,"%.*G", -decim, dval) < 0)
        {
            ffpmsg("Error in ffd2e converting float to string");
            *status = BAD_F2C;
        }
        else
        {
            /* test if E format was used, and there is no displayed decimal */
            /* If locale is French, decimal will be a comma. So look for that too. */
            if ( !strchr(cval, '.') && !strchr(cval, ',') && strchr(cval,'E') )
            {
                /* reformat value with a decimal point and single zero */
                if ( snprintf(cval, FLEN_VALUE,"%.1E", dval) < 0)
                {
                    ffpmsg("Error in ffd2e converting float to string");
                    *status = BAD_F2C;
                }
                /* convert French locale comma to a decimal point.*/
                if ((cptr = strchr(cval, ','))) *cptr = '.';

                return(*status);  
            }
        }
    }
    else
    {
        if ( snprintf(cval, FLEN_VALUE,"%.*E", decim, dval) < 0)
        {
            ffpmsg("Error in ffd2e converting float to string");
            *status = BAD_F2C;
        }
    }

    if (*status <= 0)
    {
        /* replace comma with a period (e.g. in French locale) */
        if ( (cptr = strchr(cval, ','))) *cptr = '.';

        /* test if output string is 'NaN', 'INDEF', or 'INF' */
        if (strchr(cval, 'N'))
        {
            ffpmsg("Error in ffd2e: double value is a NaN or INDEF");
            *status = BAD_F2C;
        }
        else if ( !strchr(cval, '.') && !strchr(cval,'E') && strlen(cval) < FLEN_VALUE-1)
        {
            /* add decimal point if necessary to distinquish from integer */
            strcat(cval, ".");
        }
    }

    return(*status);
}